

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_762d5::pixelArray::pixelArray(pixelArray *this,int height,int width)

{
  Array2D<Imath_3_2::half> *pAVar1;
  long in_RDI;
  int c;
  long in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  Array2D<Imath_3_2::half> *local_48;
  int local_20;
  
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  pAVar1 = (Array2D<Imath_3_2::half> *)(in_RDI + 0x48);
  do {
    local_48 = pAVar1;
    Imf_3_4::Array2D<Imath_3_2::half>::Array2D(local_48);
    pAVar1 = local_48 + 1;
  } while (local_48 + 1 != (Array2D<Imath_3_2::half> *)(in_RDI + 0xa8));
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
              (local_48,in_stack_ffffffffffffff98,(long)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

pixelArray (int height, int width)
        : i (height, width), f (height, width), h (height, width)
    {
        for (int c = 0; c < 4; ++c)
        {
            rgba[c].resizeErase (height, width);
        }
    }